

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFOBSFireFightingGraph.cpp
# Opt level: O0

Scope * __thiscall
ProblemFOBSFireFightingGraph::GetHousesAgentInfluences(ProblemFOBSFireFightingGraph *this,Index agI)

{
  Scope *in_RDI;
  Scope *houses;
  Scope *this_00;
  
  this_00 = in_RDI;
  Scope::Scope(in_RDI);
  Scope::Insert(this_00,(Index)((ulong)in_RDI >> 0x20));
  Scope::Insert(this_00,(Index)((ulong)in_RDI >> 0x20));
  return in_RDI;
}

Assistant:

Scope ProblemFOBSFireFightingGraph::GetHousesAgentInfluences(Index agI) const
{
    Scope houses;
    // agent's actions only influence two houses
    houses.Insert(agI);
    houses.Insert(agI+1);
    return(houses);
}